

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequencer.h
# Opt level: O0

void __thiscall
disruptor::Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0>::
Sequencer(Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BlockingStrategy,_0> *this,
         size_t n)

{
  RingBuffer<long,_0> *in_RSI;
  Sequence *in_RDI;
  size_t in_stack_00000010;
  MultiThreadedStrategyEx *in_stack_00000018;
  int64_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffe8;
  
  RingBuffer<long,_0>::RingBuffer(in_RSI,in_stack_ffffffffffffffe8);
  Sequence::Sequence(in_RDI,in_stack_ffffffffffffffc8);
  MultiThreadedStrategyEx::MultiThreadedStrategyEx(in_stack_00000018,in_stack_00000010);
  BlockingStrategy::BlockingStrategy((BlockingStrategy *)in_RDI);
  std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::vector
            ((vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)0x18eeb1);
  return;
}

Assistant:

Sequencer(size_t n) : ring_buffer_(n), claim_strategy_(n) {}